

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::initializeOrdinal(Datetime *this,Pig *pig)

{
  int iVar1;
  longlong lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_type previous;
  tm *__tp;
  time_t tVar6;
  long lVar7;
  long lVar8;
  int year;
  int month;
  longlong number;
  int character2;
  int character1;
  ulong local_40;
  time_t now;
  
  previous = Pig::cursor(pig);
  number = 0;
  bVar3 = Pig::getDigits(pig,&number);
  if ((((bVar3) && (number - 1U < 0x1f)) && (bVar3 = Pig::getCharacter(pig,&character1), bVar3)) &&
     (bVar3 = Pig::getCharacter(pig,&character2), bVar3)) {
    uVar4 = Pig::peek(pig);
    bVar3 = unicodeLatinAlpha(uVar4);
    if (!bVar3) {
      uVar4 = Pig::peek(pig);
      bVar3 = unicodeLatinDigit(uVar4);
      if (!bVar3) {
        lVar7 = number % 10;
        lVar8 = number % 100;
        if (((((character1 == 0x73 && lVar7 == 1) && lVar8 != 0xb) && character2 == 0x74) ||
            (((character1 == 0x6e && lVar7 == 2) && lVar8 != 0xc) && character2 == 100)) ||
           ((((character1 == 0x72 && lVar7 == 3) && lVar8 != 0xd) && character2 == 100 ||
            ((character2 == 0x68 && character1 == 0x74) &&
             ((3 < lVar7 || lVar7 == 0) || lVar8 - 0xbU < 3))))) {
          now = time((time_t *)0x0);
          __tp = localtime(&now);
          lVar2 = number;
          uVar4 = __tp->tm_mon;
          iVar1 = __tp->tm_year;
          year = iVar1 + 0x76c;
          if (((timeRelative == true) && (0 < number)) && (number <= __tp->tm_mday)) {
            if (10 < (int)uVar4) {
              year = iVar1 + 0x76d;
            }
            month = 1;
            if ((int)uVar4 < 0xb) {
              month = uVar4 + 2;
            }
          }
          else {
            month = uVar4 + 1;
            if (((timeRelative == false) && (__tp->tm_mday < number)) &&
               (local_40 = (ulong)uVar4, iVar5 = daysInMonth(year,month), lVar2 <= iVar5)) {
              iVar5 = (int)local_40;
              if (iVar5 < 1) {
                year = iVar1 + 0x76b;
              }
              month = 0xc;
              if (0 < iVar5) {
                month = iVar5;
              }
            }
          }
          __tp->tm_sec = 0;
          __tp->tm_min = 0;
          __tp->tm_hour = 0;
          __tp->tm_mon = month + -1;
          __tp->tm_mday = (int)number;
          __tp->tm_year = year + -0x76c;
          __tp->tm_isdst = -1;
          tVar6 = mktime(__tp);
          this->_date = tVar6;
          return true;
        }
      }
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::initializeOrdinal (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  long long number = 0;
  if (pig.getDigits (number) &&
      number > 0             &&
      number <= 31)
  {
    int character1;
    int character2;
    if (pig.getCharacter (character1)     &&
        pig.getCharacter (character2)     &&
        ! unicodeLatinAlpha (pig.peek ()) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      int remainder1 = number % 10;
      int remainder2 = number % 100;
      if ((remainder2 != 11 && remainder1 == 1 && character1 == 's' && character2 == 't') ||
          (remainder2 != 12 && remainder1 == 2 && character1 == 'n' && character2 == 'd') ||
          (remainder2 != 13 && remainder1 == 3 && character1 == 'r' && character2 == 'd') ||
          ((remainder2 == 11 ||
            remainder2 == 12 ||
            remainder2 == 13 ||
            remainder1 == 0 ||
            remainder1 > 3) && character1 == 't' && character2 == 'h'))
      {
        time_t now = time (nullptr);
        struct tm* t = localtime (&now);

        int y = t->tm_year + 1900;
        int m = t->tm_mon + 1;
        int d = t->tm_mday;

        if (timeRelative && (1 <= number && number <= d))
        {
          if (++m > 12)
          {
            m = 1;
            y++;
          }
        }
        else if (!timeRelative && (d < number && number <= daysInMonth (y, m)))
        {
          if (--m < 1)
          {
            m = 12;
            y--;
          }
        }

        t->tm_hour = t->tm_min = t->tm_sec = 0;
        t->tm_mon  = m - 1;
        t->tm_mday = number;
        t->tm_year = y - 1900;
        t->tm_isdst = -1;

        _date = mktime (t);

        return true;
      }
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}